

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O3

EventSource __thiscall XMISong::FindNextDue(XMISong *this)

{
  uint uVar1;
  uint uVar2;
  
  if (this->CurrSong->Finished == true) {
    uVar1 = 0xffffffff;
    if ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count == 0) {
      return EVENT_None;
    }
  }
  else {
    uVar1 = this->CurrSong->Delay;
    if ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count == 0) {
      uVar2 = 0xffffffff;
      goto LAB_0033d254;
    }
  }
  uVar2 = ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array)->Delay;
LAB_0033d254:
  return EVENT_Fake - (uVar1 < uVar2);
}

Assistant:

XMISong::EventSource XMISong::FindNextDue()
{
	// Are there still events available?
	if (CurrSong->Finished && NoteOffs.Size() == 0)
	{
		return EVENT_None;
	}

	// Which is due sooner? The current song or the note-offs?
	DWORD real_delay = CurrSong->Finished ? 0xFFFFFFFF : CurrSong->Delay;
	DWORD fake_delay = NoteOffs.Size() == 0 ? 0xFFFFFFFF : NoteOffs[0].Delay;

	return (fake_delay <= real_delay) ? EVENT_Fake : EVENT_Real;
}